

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O0

BOOL SetEnvironmentVariableA(LPCSTR lpName,LPCSTR lpValue)

{
  int iVar1;
  BOOL BVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  LPSTR string;
  int iLen;
  int nResult;
  BOOL bRet;
  LPCSTR lpValue_local;
  LPCSTR lpName_local;
  
  iLen = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if ((lpName == (LPCSTR)0x0) || (*lpName == '\0')) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    goto LAB_001562fa;
  }
  if (lpValue == (LPCSTR)0x0) {
    pcVar3 = MiscGetenv(lpName);
    if (pcVar3 == (char *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(0xcb);
      goto LAB_001562fa;
    }
    MiscUnsetenv(lpName);
  }
  else {
    sVar4 = strlen(lpName);
    sVar5 = strlen(lpValue);
    iVar1 = (int)sVar4 + (int)sVar5 + 2;
    pcVar3 = (char *)PAL_malloc((long)iVar1);
    if (pcVar3 == (char *)0x0) {
      iLen = 0;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(8);
      goto LAB_001562fa;
    }
    sprintf_s(pcVar3,(long)iVar1,"%s=%s",lpName,lpValue);
    BVar2 = MiscPutenv(pcVar3,0);
    iVar1 = -1;
    if (BVar2 != 0) {
      iVar1 = 0;
    }
    PAL_free(pcVar3);
    if (iVar1 == -1) {
      iLen = 0;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(8);
      goto LAB_001562fa;
    }
  }
  iLen = 1;
LAB_001562fa:
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return iLen;
  }
  abort();
}

Assistant:

BOOL
PALAPI
SetEnvironmentVariableA(
			IN LPCSTR lpName,
			IN LPCSTR lpValue)
{

    BOOL bRet = FALSE;
    int nResult =0;
    PERF_ENTRY(SetEnvironmentVariableA);
    ENTRY("SetEnvironmentVariableA(lpName=%p (%s), lpValue=%p (%s))\n",
        lpName?lpName:"NULL",
        lpName?lpName:"NULL", lpValue?lpValue:"NULL", lpValue?lpValue:"NULL");

    /*check if the input variable name is null
     * and if so exit*/
    if ((lpName == NULL) || (lpName[0] == 0))
    {
        ERROR("lpName is NULL\n");
        goto done;
    }
    /*check if the input value is null and if so
     * check if the input name is valid and delete
     * the variable name from process environment*/
    if (lpValue == NULL)
    {
        if ((lpValue = MiscGetenv(lpName)) == NULL)
        {
            ERROR("Couldn't find environment variable (%s)\n", lpName);
            SetLastError(ERROR_ENVVAR_NOT_FOUND);
            goto done;
        }
        MiscUnsetenv(lpName);
    }
    /*All the conditions are met. Set the variable*/
    else
    {
        int iLen = strlen(lpName) + strlen(lpValue) + 2;
        LPSTR string = (LPSTR) PAL_malloc(iLen);
        if (string == NULL)
        {
            bRet = FALSE;
            ERROR("Unable to allocate memory\n");
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        
        sprintf_s(string, iLen, "%s=%s", lpName, lpValue);
        nResult = MiscPutenv(string, FALSE) ? 0 : -1;

        PAL_free(string);
        string = NULL;
        
        // If MiscPutenv returns FALSE, it almost certainly failed to
        // allocate memory.        
        if(nResult == -1)
        {
            bRet = FALSE;
            ERROR("Unable to allocate memory\n");
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
    }
    bRet = TRUE;
done:
    LOGEXIT("SetEnvironmentVariableA returning BOOL %d\n", bRet);    
    PERF_EXIT(SetEnvironmentVariableA);
    return bRet;
}